

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,bool to_array)

{
  FieldGenerator *pFVar1;
  FieldDescriptor *field_00;
  string sStack_48;
  
  anon_unknown_0::PrintFieldComment(printer,field);
  if (*(int *)(field + 0x30) != 3) {
    FieldName_abi_cxx11_(&sStack_48,(cxx *)field,field_00);
    io::Printer::Print(printer,"if (has_$name$()) {\n","name",&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    io::Printer::Indent(printer);
  }
  pFVar1 = FieldGeneratorMap::get(&this->field_generators_,field);
  (*pFVar1->_vptr_FieldGenerator[(ulong)to_array + 0xf])(pFVar1,printer);
  if (*(int *)(field + 0x30) != 3) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,"\n");
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field, bool to_array) {
  PrintFieldComment(printer, field);

  if (!field->is_repeated()) {
    printer->Print(
      "if (has_$name$()) {\n",
      "name", FieldName(field));
    printer->Indent();
  }

  if (to_array) {
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
  } else {
    field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
  }

  if (!field->is_repeated()) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
}